

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

void __thiscall Lexer_Floats_Test::TestBody(Lexer_Floats_Test *this)

{
  int *lxr;
  int *lhs;
  int *lhs_00;
  anon_union_8_2_0c43866c_for_TkInfo_4 *this_00;
  char *pcVar1;
  undefined1 local_198 [8];
  MockLexer mock;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  mock_new((MockLexer *)local_198,"3.0 4.0000 3.1415926535 3. 42.09 3e4 3e+4 3e-4 3.14e2 42.51E2");
  lxr = &mock.vm.stack_size;
  lex_next((Lexer *)lxr);
  lhs = &mock.lxr.cursor;
  local_38.ptr_._0_4_ = 0x115;
  testing::internal::CmpHelperEQ<int,multi_tks>
            ((internal *)&mock.lxr.tk.field_4,"mock.lxr.tk.type","TK_NUM",lhs,(multi_tks *)&local_38
            );
  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
               ,0x9e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    lhs_00 = &mock.lxr.tk.length;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x4008000000000000;
    this_00 = &mock.lxr.tk.field_4;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)this_00,"mock.lxr.tk.num","3.0",(double *)lhs_00,(double *)&local_38);
    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                 ,0x9f,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      lex_next((Lexer *)lxr);
      local_38.ptr_._0_4_ = 0x115;
      testing::internal::CmpHelperEQ<int,multi_tks>
                ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,(multi_tks *)&local_38);
      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
        testing::Message::Message((Message *)&local_38);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                   ,0xa0,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             0x4010000000000000;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)this_00,"mock.lxr.tk.num","4.0",(double *)lhs_00,(double *)&local_38)
        ;
        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
          testing::Message::Message((Message *)&local_38);
          if (gtest_ar._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                     ,0xa1,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
          lex_next((Lexer *)lxr);
          local_38.ptr_._0_4_ = 0x115;
          testing::internal::CmpHelperEQ<int,multi_tks>
                    ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,(multi_tks *)&local_38);
          if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
            testing::Message::Message((Message *)&local_38);
            if (gtest_ar._0_8_ == 0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                       ,0xa2,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            local_38.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x400921fb54411744;
            testing::internal::CmpHelperEQ<double,double>
                      ((internal *)this_00,"mock.lxr.tk.num","3.1415926535",(double *)lhs_00,
                       (double *)&local_38);
            if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
              testing::Message::Message((Message *)&local_38);
              if (gtest_ar._0_8_ == 0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                         ,0xa3,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar);
              lex_next((Lexer *)lxr);
              local_38.ptr_._0_4_ = 0x115;
              testing::internal::CmpHelperEQ<int,multi_tks>
                        ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,(multi_tks *)&local_38)
              ;
              if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                testing::Message::Message((Message *)&local_38);
                if (gtest_ar._0_8_ == 0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                           ,0xa4,pcVar1);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar);
                local_38.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0x4008000000000000;
                testing::internal::CmpHelperEQ<double,double>
                          ((internal *)this_00,"mock.lxr.tk.num","3.0",(double *)lhs_00,
                           (double *)&local_38);
                if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                  testing::Message::Message((Message *)&local_38);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar1 = "";
                  }
                  else {
                    pcVar1 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                             ,0xa5,pcVar1);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar);
                  lex_next((Lexer *)lxr);
                  local_38.ptr_._0_4_ = 0x115;
                  testing::internal::CmpHelperEQ<int,multi_tks>
                            ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,
                             (multi_tks *)&local_38);
                  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                    testing::Message::Message((Message *)&local_38);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                               ,0xa6,pcVar1);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar);
                    local_38.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x40450b851eb851ec;
                    testing::internal::CmpHelperEQ<double,double>
                              ((internal *)this_00,"mock.lxr.tk.num","42.09",(double *)lhs_00,
                               (double *)&local_38);
                    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                      testing::Message::Message((Message *)&local_38);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar1 = "";
                      }
                      else {
                        pcVar1 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                 ,0xa7,pcVar1);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar);
                      lex_next((Lexer *)lxr);
                      local_38.ptr_._0_4_ = 0x115;
                      testing::internal::CmpHelperEQ<int,multi_tks>
                                ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,
                                 (multi_tks *)&local_38);
                      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                        testing::Message::Message((Message *)&local_38);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar1 = "";
                        }
                        else {
                          pcVar1 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                   ,0xa8,pcVar1);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&gtest_ar);
                        local_38.ptr_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)0x40dd4c0000000000;
                        testing::internal::CmpHelperEQ<double,double>
                                  ((internal *)this_00,"mock.lxr.tk.num","30000.0",(double *)lhs_00,
                                   (double *)&local_38);
                        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                          testing::Message::Message((Message *)&local_38);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar1 = "";
                          }
                          else {
                            pcVar1 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                     ,0xa9,pcVar1);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&gtest_ar);
                          lex_next((Lexer *)lxr);
                          local_38.ptr_._0_4_ = 0x115;
                          testing::internal::CmpHelperEQ<int,multi_tks>
                                    ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,
                                     (multi_tks *)&local_38);
                          if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                            testing::Message::Message((Message *)&local_38);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar1 = "";
                            }
                            else {
                              pcVar1 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                       ,0xaa,pcVar1);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                          }
                          else {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&gtest_ar);
                            local_38.ptr_ =
                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x40dd4c0000000000;
                            testing::internal::CmpHelperEQ<double,double>
                                      ((internal *)this_00,"mock.lxr.tk.num","30000.0",
                                       (double *)lhs_00,(double *)&local_38);
                            if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                              testing::Message::Message((Message *)&local_38);
                              if (gtest_ar._0_8_ == 0) {
                                pcVar1 = "";
                              }
                              else {
                                pcVar1 = *(char **)gtest_ar._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                         ,0xab,pcVar1);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&gtest_ar);
                              lex_next((Lexer *)lxr);
                              local_38.ptr_._0_4_ = 0x115;
                              testing::internal::CmpHelperEQ<int,multi_tks>
                                        ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,
                                         (multi_tks *)&local_38);
                              if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                testing::Message::Message((Message *)&local_38);
                                if (gtest_ar._0_8_ == 0) {
                                  pcVar1 = "";
                                }
                                else {
                                  pcVar1 = *(char **)gtest_ar._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                           ,0xac,pcVar1);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                              }
                              else {
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&gtest_ar);
                                local_38.ptr_ =
                                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x3f33a92a30553261;
                                testing::internal::CmpHelperEQ<double,double>
                                          ((internal *)this_00,"mock.lxr.tk.num","0.0003",
                                           (double *)lhs_00,(double *)&local_38);
                                if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                  testing::Message::Message((Message *)&local_38);
                                  if (gtest_ar._0_8_ == 0) {
                                    pcVar1 = "";
                                  }
                                  else {
                                    pcVar1 = *(char **)gtest_ar._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                             ,0xad,pcVar1);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38
                                            );
                                }
                                else {
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&gtest_ar);
                                  lex_next((Lexer *)lxr);
                                  local_38.ptr_._0_4_ = 0x115;
                                  testing::internal::CmpHelperEQ<int,multi_tks>
                                            ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs,
                                             (multi_tks *)&local_38);
                                  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                    testing::Message::Message((Message *)&local_38);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar1 = "";
                                    }
                                    else {
                                      pcVar1 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                               ,0xae,pcVar1);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar.message_,
                                               (Message *)&local_38);
                                  }
                                  else {
                                    testing::internal::
                                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                    local_38.ptr_ =
                                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x4073a00000000000;
                                    testing::internal::CmpHelperEQ<double,double>
                                              ((internal *)this_00,"mock.lxr.tk.num","314.0",
                                               (double *)lhs_00,(double *)&local_38);
                                    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                      testing::Message::Message((Message *)&local_38);
                                      if (gtest_ar._0_8_ == 0) {
                                        pcVar1 = "";
                                      }
                                      else {
                                        pcVar1 = *(char **)gtest_ar._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                 ,0xaf,pcVar1);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar.message_,
                                                 (Message *)&local_38);
                                    }
                                    else {
                                      testing::internal::
                                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                      lex_next((Lexer *)lxr);
                                      local_38.ptr_._0_4_ = 0x115;
                                      testing::internal::CmpHelperEQ<int,multi_tks>
                                                ((internal *)this_00,"mock.lxr.tk.type","TK_NUM",lhs
                                                 ,(multi_tks *)&local_38);
                                      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                        testing::Message::Message((Message *)&local_38);
                                        if (gtest_ar._0_8_ == 0) {
                                          pcVar1 = "";
                                        }
                                        else {
                                          pcVar1 = *(char **)gtest_ar._0_8_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb0,pcVar1);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar.message_,
                                                   (Message *)&local_38);
                                      }
                                      else {
                                        testing::internal::
                                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                        local_38.ptr_ =
                                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)0x40b09b0000000000;
                                        testing::internal::CmpHelperEQ<double,double>
                                                  ((internal *)this_00,"mock.lxr.tk.num","4251.0",
                                                   (double *)lhs_00,(double *)&local_38);
                                        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                                          testing::Message::Message((Message *)&local_38);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar1 = "";
                                          }
                                          else {
                                            pcVar1 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb1,pcVar1);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar.message_,
                                                     (Message *)&local_38);
                                        }
                                        else {
                                          testing::internal::
                                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                          lex_next((Lexer *)lxr);
                                          local_38.ptr_._0_4_ = 0x119;
                                          testing::internal::CmpHelperEQ<int,multi_tks>
                                                    ((internal *)&mock.lxr.tk.field_4,
                                                     "mock.lxr.tk.type","TK_EOF",lhs,
                                                     (multi_tks *)&local_38);
                                          if (mock.lxr.tk.field_4.ident_hash._0_1_ != '\0') {
                                            testing::internal::
                                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                            vm_free((VM *)local_198);
                                            return;
                                          }
                                          testing::Message::Message((Message *)&local_38);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar1 = "";
                                          }
                                          else {
                                            pcVar1 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb2,pcVar1);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar.message_,
                                                     (Message *)&local_38);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(Lexer, Floats) {
	MockLexer mock = mock_new("3.0 4.0000 3.1415926535 3. 42.09 3e4 3e+4 "
		"3e-4 3.14e2 42.51E2");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 4.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.1415926535);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 42.09);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 30000.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 30000.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 0.0003);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 314.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 4251.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}